

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O2

int panic(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = lua_type(L,-1);
  if (iVar1 == 4) {
    pcVar2 = lua_tolstring(L,-1,(size_t *)0x0);
  }
  else {
    pcVar2 = "error object is not a string";
  }
  fprintf(_stderr,"PANIC: unprotected error in call to Lua API (%s)\n",pcVar2);
  fflush(_stderr);
  return 0;
}

Assistant:

static int panic (lua_State *L) {
  const char *msg = (lua_type(L, -1) == LUA_TSTRING)
                  ? lua_tostring(L, -1)
                  : "error object is not a string";
  lua_writestringerror("PANIC: unprotected error in call to Lua API (%s)\n",
                        msg);
  return 0;  /* return to Lua to abort */
}